

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timestep_embedding.cpp
# Opt level: O1

void set_timestep_embedding(ggml_tensor *timesteps,ggml_tensor *embedding,int dim,int max_period)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  float fVar4;
  double dVar5;
  vector<float,_std::allocator<float>_> freqs;
  allocator_type local_59;
  double local_58;
  double local_50;
  vector<float,_std::allocator<float>_> local_48;
  
  uVar2 = dim / 2;
  std::vector<float,_std::allocator<float>_>::vector(&local_48,(long)(int)uVar2,&local_59);
  if (1 < dim) {
    local_58 = (double)max_period;
    local_50 = (double)(int)uVar2;
    uVar1 = 0;
    do {
      dVar5 = log(local_58);
      dVar5 = exp((-dVar5 * (double)(int)uVar1) / local_50);
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar1] = (float)dVar5;
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  if (0 < timesteps->ne[0]) {
    local_50 = (double)(long)dim;
    uVar1 = 0;
    do {
      if (1 < dim) {
        uVar3 = 0;
        do {
          fVar4 = (float)ggml_get_f32_1d(timesteps,uVar1 & 0xffffffff);
          local_58 = (double)CONCAT44(local_58._4_4_,
                                      fVar4 * local_48.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start[uVar3]);
          fVar4 = cosf(fVar4 * local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar3]);
          ggml_tensor_set_f32(embedding,fVar4,(int)uVar3,(int)uVar1,0,0);
          fVar4 = sinf(local_58._0_4_);
          ggml_tensor_set_f32(embedding,fVar4,uVar2 + (int)uVar3,(int)uVar1,0,0);
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      if ((dim & 1U) != 0) {
        *(undefined4 *)
         ((long)embedding->data + embedding->nb[0] * (long)local_50 + embedding->nb[1] * uVar1) = 0;
      }
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < timesteps->ne[0]);
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void set_timestep_embedding(struct ggml_tensor* timesteps, struct ggml_tensor* embedding, int dim, int max_period = 10000) {
    // timesteps: [N,]
    // embedding: [dim, N]
    int half = dim / 2;
    std::vector<float> freqs(half);
    for (int i = 0; i < half; ++i) {
        freqs[i] = (float)std::exp(-std::log(max_period) * i / half);
    }
    for (int i = 0; i < timesteps->ne[0]; ++i) {
        for (int j = 0; j < half; ++j) {
            float arg = ggml_get_f32_1d(timesteps, i) * freqs[j];
            ggml_tensor_set_f32(embedding, std::cos(arg), j, i);
            ggml_tensor_set_f32(embedding, std::sin(arg), j + half, i);
        }
        if (dim % 2 != 0) {
            *(float*)((char*)embedding->data + i * embedding->nb[1] + dim * embedding->nb[0]) = 0;
        }
    }
}